

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero_Test *this)

{
  uint32_t vout;
  pointer pTVar1;
  bool bVar2;
  pointer utxo;
  pointer hex;
  Amount AVar3;
  bool use_bnb;
  allocator local_199;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Txid txid;
  string local_158;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  Amount local_118;
  Amount local_108;
  Amount local_f8;
  Amount fee_value;
  Amount select_value;
  CoinSelection coin_select;
  CoinSelectionOption option_params;
  
  cfd::CoinSelection::CoinSelection(&coin_select,true);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(5);
  local_f8.amount_ = AVar3.amount_;
  local_f8.ignore_check_ = AVar3.ignore_check_;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee_value);
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_108.amount_ = AVar3.amount_;
  local_108.ignore_check_ = AVar3.ignore_check_;
  use_bnb = false;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectTestVector.
                           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)kExtCoinSelectTestVector.
                          super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  pTVar1 = kExtCoinSelectTestVector.
           super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
         super__Vector_impl_data._M_start;
  for (hex = kExtCoinSelectTestVector.
             super__Vector_base<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>._M_impl.
             super__Vector_impl_data._M_start; hex != pTVar1; hex = hex + 1) {
    cfd::core::Txid::Txid(&txid);
    if ((hex->txid)._M_string_length != 0) {
      cfd::core::Txid::Txid((Txid *)&local_158,&hex->txid);
      cfd::core::Txid::operator=(&txid,(Txid *)&local_158);
      cfd::core::Txid::~Txid((Txid *)&local_158);
    }
    vout = hex->vout;
    AVar3 = cfd::core::Amount::CreateBySatoshiAmount(10);
    local_118.amount_ = AVar3.amount_;
    local_118.ignore_check_ = AVar3.ignore_check_;
    std::__cxx11::string::string((string *)&local_158,"",&local_199);
    cfd::CoinSelection::ConvertToUtxo
              (&txid,vout,&hex->descriptor,&local_118,&local_158,(void *)0x0,utxo,(Script *)0x0);
    std::__cxx11::string::~string((string *)&local_158);
    utxo = utxo + 1;
    cfd::core::Txid::~Txid(&txid);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,1.0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid,&coin_select,&local_f8,&utxos,
               &exp_filter,&option_params,&local_108,&select_value,&fee_value,&use_bnb);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::_M_move_assign(&select_utxos,&txid);
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
              ((_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&txid);
  }
  testing::Message::Message((Message *)&txid);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x275,
             "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&txid);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&select_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option_params.fee_asset_);
  std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
            (&utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&coin_select.randomize_cache_.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_SelectCoinsBnB_effective_value_zero)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(5);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(10), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)), CfdException);
}